

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O2

void __thiscall depspawn::internal::ThreadPool::resize(ThreadPool *this,int new_nthreads)

{
  int iVar1;
  domain_error *this_00;
  undefined4 in_register_00000034;
  void *__stat_loc;
  ThreadPool *local_48;
  code *local_40;
  undefined8 local_38;
  
  __stat_loc = (void *)CONCAT44(in_register_00000034,new_nthreads);
  if (new_nthreads < 0) {
    iVar1 = std::thread::hardware_concurrency();
    new_nthreads = new_nthreads + iVar1;
    if (new_nthreads < 0) {
      this_00 = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error(this_00,"Negative number of threads");
      __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
  }
  wait(this,__stat_loc);
  while ((ulong)((long)(this->threads_).
                       super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->threads_).
                       super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) < (ulong)(uint)new_nthreads) {
    local_40 = main;
    local_38 = 0;
    local_48 = this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(depspawn::internal::ThreadPool::*)(),depspawn::internal::ThreadPool*>
              ((vector<std::thread,std::allocator<std::thread>> *)this,(type *)&local_40,&local_48);
  }
  this->nthreads_in_use_ = new_nthreads;
  return;
}

Assistant:

void resize(int new_nthreads)
  {

    if(new_nthreads < 0 ) {
      new_nthreads += static_cast<int>(std::thread::hardware_concurrency());
      if (new_nthreads < 0) {
        throw std::domain_error("Negative number of threads");
      }
    }

    wait();

    // can only grow
    while (threads_.size() < static_cast<size_t>(new_nthreads)) {
      threads_.emplace_back(&ThreadPool::main, this);
    }
    nthreads_in_use_ = new_nthreads;
  }